

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O0

Dim * __thiscall
cnn::SelectCols::dim_forward(SelectCols *this,vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  size_type sVar2;
  const_reference pvVar3;
  ostream *this_00;
  invalid_argument *this_01;
  vector<cnn::Dim,_std::allocator<cnn::Dim>_> *in_RDX;
  ostream *in_RSI;
  Dim *in_RDI;
  uint ncols;
  uint local_38;
  uint local_34;
  uint in_stack_ffffffffffffffe4;
  
  sVar2 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::size(in_RDX);
  if (sVar2 == 1) {
    pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
    uVar1 = Dim::ndims(pvVar3);
    if (uVar1 == 2) {
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RSI + 0x68));
      uVar1 = (uint)sVar2;
      pvVar3 = std::vector<cnn::Dim,_std::allocator<cnn::Dim>_>::operator[](in_RDX,0);
      local_34 = uVar1;
      local_38 = Dim::rows(pvVar3);
      x._M_len._0_4_ = local_34;
      x._M_array = (iterator)0x2;
      x._M_len._4_4_ = in_stack_ffffffffffffffe4;
      Dim::Dim((Dim *)&local_38,x);
      return in_RDI;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Bad arguments in SelectCols: ");
  this_00 = cnn::operator<<(in_RSI,(vector<cnn::Dim,_std::allocator<cnn::Dim>_> *)in_RDI);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_01,"invalid arguments to SelectCols");
  __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim SelectCols::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 1 || xs[0].ndims() != 2) {
    cerr << "Bad arguments in SelectCols: " << xs << endl;
    throw std::invalid_argument("invalid arguments to SelectCols");
  }
  unsigned ncols = pcols->size();
  return Dim({xs[0].rows(), ncols});
}